

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_core.hpp
# Opt level: O2

bool __thiscall
boost::threadpool::detail::
pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
::schedule(pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
           *this,task_type *task)

{
  recursive_mutex::lock(&this->m_monitor);
  std::deque<boost::function0<void>,_std::allocator<boost::function0<void>_>_>::push_back
            (&(this->m_scheduler).m_container,task);
  condition_variable_any::notify_one(&this->m_task_or_terminate_workers_event);
  recursive_mutex::unlock(&this->m_monitor);
  return true;
}

Assistant:

bool schedule(task_type const & task) volatile
    {	
      locking_ptr<pool_type, recursive_mutex> lockedThis(*this, m_monitor); 
      
      if(lockedThis->m_scheduler.push(task))
      {
        lockedThis->m_task_or_terminate_workers_event.notify_one();
        return true;
      }
      else
      {
        return false;
      }
    }